

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgknm(char *card,char *name,int *length,int *status)

{
  char *pcVar1;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  int namelength;
  int ii;
  char *ptr2;
  char *ptr1;
  int local_48;
  int local_44;
  int local_3c;
  char *local_30;
  
  *in_RSI = '\0';
  *in_RDX = 0;
  if (*in_RDI < 'H') {
    local_44 = -1;
  }
  else {
    if (*in_RDI < 'I') {
      local_48 = strncmp(in_RDI,"HIERARCH ",9);
    }
    else {
      local_48 = 1;
    }
    local_44 = local_48;
  }
  if (local_44 == 0) {
    pcVar1 = strchr(in_RDI,0x3d);
    if (pcVar1 == (char *)0x0) {
      strcat(in_RSI,"HIERARCH");
      *in_RDX = 8;
      return *in_RCX;
    }
    for (local_30 = in_RDI + 9; *local_30 == ' '; local_30 = local_30 + 1) {
    }
    strncat(in_RSI,local_30,(long)pcVar1 - (long)local_30);
    local_3c = (int)pcVar1 - (int)local_30;
    while( true ) {
      bVar2 = false;
      if (0 < local_3c) {
        bVar2 = in_RSI[local_3c + -1] == ' ';
      }
      if (!bVar2) break;
      local_3c = local_3c + -1;
    }
    in_RSI[local_3c] = '\0';
    *in_RDX = local_3c;
  }
  else {
    for (local_3c = 0; local_3c < 0x4a; local_3c = local_3c + 1) {
      if (((in_RDI[local_3c] == ' ') || (in_RDI[local_3c] == '=')) || (in_RDI[local_3c] == '\0')) {
        in_RSI[local_3c] = '\0';
        *in_RDX = local_3c;
        return *in_RCX;
      }
      in_RSI[local_3c] = in_RDI[local_3c];
    }
    in_RSI[0x4a] = '\0';
    *in_RDX = 0x4a;
  }
  return *in_RCX;
}

Assistant:

int ffgknm( char *card,         /* I - keyword card                   */
            char *name,         /* O - name of the keyword            */
            int *length,        /* O - length of the keyword name     */
            int  *status)       /* IO - error status                  */

/*
  Return the name of the keyword, and the name length.  This supports the
  ESO HIERARCH convention where keyword names may be > 8 characters long.
*/
{
    char *ptr1, *ptr2;
    int ii, namelength;

    namelength = FLEN_KEYWORD - 1;
    *name = '\0';
    *length = 0;

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
        ptr2 = strchr(card, '=');

        if (!ptr2)   /* no value indicator ??? */
        {
            /* this probably indicates an error, so just return FITS name */
            strcat(name, "HIERARCH");
            *length = 8;
            return(*status);
        }

        /* find the start and end of the HIERARCH name */
        ptr1 = &card[9];
        while (*ptr1 == ' ')   /* skip spaces */
            ptr1++;

        strncat(name, ptr1, ptr2 - ptr1);
        ii = ptr2 - ptr1;

        while (ii > 0 && name[ii - 1] == ' ')  /* remove trailing spaces */
            ii--;

        name[ii] = '\0';
        *length = ii;
    }
    else
    {
        for (ii = 0; ii < namelength; ii++)
        {
           /* look for string terminator, or a blank */
           if (*(card+ii) != ' ' && *(card+ii) != '=' && *(card+ii) !='\0')
           {
               *(name+ii) = *(card+ii);
           }
           else
           {
               name[ii] = '\0';
               *length = ii;
               return(*status);
           }
        }

        /* if we got here, keyword is namelength characters long */
        name[namelength] = '\0';
        *length = namelength;
    }

    return(*status);
}